

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

string * __thiscall
GrcManager::ExpressionDebugString_abi_cxx11_
          (string *__return_storage_ptr__,GrcManager *this,ExpressionType expt)

{
  char *pcVar1;
  char *pcVar2;
  
  switch((int)this) {
  case 1:
  case 4:
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "integer";
    pcVar1 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "boolean";
    pcVar1 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "em-units";
    pcVar1 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "slot-ref";
    pcVar1 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "string";
    pcVar1 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "point";
    pcVar1 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "gid";
    pcVar1 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GrcManager::ExpressionDebugString(ExpressionType expt)
{
	switch (expt)
	{
	default:
	case kexptUnknown:	return "unknown";
	case kexptZero:
	case kexptOne:
	case kexptNumber:	return "integer";
	case kexptBoolean:	return "boolean";
	case kexptMeas:		return "em-units";
	case kexptSlotRef:	return "slot-ref";
	case kexptString:	return "string";
	case kexptPoint:	return "point";
	case kexptGlyphID:	return "gid";
	}
}